

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_FEA_basic.cpp
# Opt level: O0

void test_2(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChStreamOutAscii *pCVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  ChVector<double> local_6a0;
  ChVector<double> local_688;
  ChVector<double> local_670;
  shared_ptr<chrono::ChSolver> local_658;
  undefined1 local_648 [8];
  shared_ptr<chrono::ChSolverMINRES> solver;
  shared_ptr<chrono::ChPhysicsItem> local_628;
  shared_ptr<chrono::ChPhysicsItem> local_618;
  shared_ptr<chrono::ChBodyFrame> local_608;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_5f8;
  shared_ptr<chrono::ChBodyFrame> local_5e8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_5d8;
  shared_ptr<chrono::ChBodyFrame> local_5c8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_5b8;
  undefined1 local_5a8 [8];
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint3;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint2;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint1;
  undefined1 local_568 [8];
  shared_ptr<chrono::ChBody> truss;
  shared_ptr<chrono::fea::ChElementBase> local_548;
  shared_ptr<chrono::fea::ChContinuumElastic> local_538;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_528;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_518;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_508;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_4f8;
  undefined1 local_4e8 [8];
  shared_ptr<chrono::fea::ChElementTetraCorot_4> melement1;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_4c8;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_4b8;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_4a8;
  ChVector<double> local_498;
  ChVector<double> local_480;
  undefined1 local_468 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode4;
  undefined1 local_440 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode3;
  undefined1 local_418 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode2;
  undefined1 local_3f0 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode1;
  shared_ptr<chrono::fea::ChContinuumElastic> mmaterial;
  undefined1 local_3c0 [8];
  shared_ptr<chrono::fea::ChMesh> my_mesh;
  ChSystemSMC sys;
  
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar2,"\n-------------------------------------------------\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar2,"TEST: LINEAR tetrahedral element FEM  \n\n");
  chrono::ChSystemSMC::ChSystemSMC
            ((ChSystemSMC *)
             &my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,true);
  chrono_types::make_shared<chrono::fea::ChMesh,_0>();
  chrono_types::make_shared<chrono::fea::ChContinuumElastic,_0>();
  std::
  __shared_ptr_access<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
  chrono::fea::ChContinuumElastic::Set_E(10000000.0);
  std::
  __shared_ptr_access<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
  chrono::fea::ChContinuumElastic::Set_v(0.3);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.0,0.0,0.0);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_3f0);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.0,0.0,1.0);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_418);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.0,1.0,0.0);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_440);
  chrono::ChVector<double>::ChVector(&local_480,1.0,0.0,0.0);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_468);
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_440);
  chrono::ChVector<double>::ChVector(&local_498,0.0,10000.0,0.0);
  (**(code **)(*(long *)peVar3 + 0x68))(peVar3,&local_498);
  peVar4 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3c0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_4a8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_3f0);
  chrono::fea::ChMesh::AddNode(peVar4,&local_4a8);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_4a8);
  peVar4 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3c0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_4b8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_418);
  chrono::fea::ChMesh::AddNode(peVar4,&local_4b8);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_4b8);
  peVar4 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3c0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_4c8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_440);
  chrono::fea::ChMesh::AddNode(peVar4,&local_4c8);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_4c8);
  peVar4 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3c0);
  p_Var1 = &melement1.
            super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            ((shared_ptr<chrono::fea::ChNodeFEAbase> *)p_Var1,
             (shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_468);
  chrono::fea::ChMesh::AddNode(peVar4,p_Var1);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAbase> *)
             &melement1.
              super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono_types::make_shared<chrono::fea::ChElementTetraCorot_4,_0>();
  peVar5 = std::
           __shared_ptr_access<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4e8);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_4f8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_3f0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_508,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_418);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_518,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_440);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_528,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_468);
  (**(code **)(*(long *)peVar5 + 0x38))(peVar5,&local_4f8,&local_508,&local_518,&local_528);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_528);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_518);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_508);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_4f8);
  peVar5 = std::
           __shared_ptr_access<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4e8);
  std::shared_ptr<chrono::fea::ChContinuumElastic>::shared_ptr
            (&local_538,
             (shared_ptr<chrono::fea::ChContinuumElastic> *)
             &mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono::fea::ChElementTetraCorot_4::SetMaterial(peVar5,&local_538);
  std::shared_ptr<chrono::fea::ChContinuumElastic>::~shared_ptr(&local_538);
  peVar4 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3c0);
  std::shared_ptr<chrono::fea::ChElementBase>::shared_ptr<chrono::fea::ChElementTetraCorot_4,void>
            (&local_548,(shared_ptr<chrono::fea::ChElementTetraCorot_4> *)local_4e8);
  chrono::fea::ChMesh::AddElement(peVar4,&local_548);
  std::shared_ptr<chrono::fea::ChElementBase>::~shared_ptr(&local_548);
  p_Var1 = &truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChMesh,void>
            ((shared_ptr<chrono::ChPhysicsItem> *)p_Var1,
             (shared_ptr<chrono::fea::ChMesh> *)local_3c0);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,p_Var1);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr
            ((shared_ptr<chrono::ChPhysicsItem> *)
             &truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  chrono_types::make_shared<chrono::ChBody,_0>();
  peVar6 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_568);
  chrono::ChBody::SetBodyFixed(SUB81(peVar6,0));
  p_Var1 = &constraint1.
            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::ChBody,void>
            ((shared_ptr<chrono::ChPhysicsItem> *)p_Var1,(shared_ptr<chrono::ChBody> *)local_568);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,p_Var1);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr
            ((shared_ptr<chrono::ChPhysicsItem> *)
             &constraint1.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono_types::make_shared<chrono::fea::ChLinkPointFrame,_0>();
  chrono_types::make_shared<chrono::fea::ChLinkPointFrame,_0>();
  chrono_types::make_shared<chrono::fea::ChLinkPointFrame,_0>();
  peVar7 = std::
           __shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&constraint2.
                            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_5b8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_3f0);
  std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>
            (&local_5c8,(shared_ptr<chrono::ChBody> *)local_568);
  (**(code **)(*(long *)peVar7 + 0x220))(peVar7,&local_5b8,&local_5c8,0);
  std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_5c8);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_5b8);
  peVar7 = std::
           __shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&constraint3.
                            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_5d8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_418);
  std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>
            (&local_5e8,(shared_ptr<chrono::ChBody> *)local_568);
  (**(code **)(*(long *)peVar7 + 0x220))(peVar7,&local_5d8,&local_5e8,0);
  std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_5e8);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_5d8);
  peVar7 = std::
           __shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_5a8);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_5f8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_468);
  std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>
            (&local_608,(shared_ptr<chrono::ChBody> *)local_568);
  (**(code **)(*(long *)peVar7 + 0x220))(peVar7,&local_5f8,&local_608,0);
  std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_608);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_5f8);
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (&local_618,
             (shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint2.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_618);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr(&local_618);
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (&local_628,
             (shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint3.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_628);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr(&local_628);
  p_Var1 = &solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChLinkPointFrame,void>
            ((shared_ptr<chrono::ChPhysicsItem> *)p_Var1,
             (shared_ptr<chrono::fea::ChLinkPointFrame> *)local_5a8);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,p_Var1);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr
            ((shared_ptr<chrono::ChPhysicsItem> *)
             &solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono_types::make_shared<chrono::ChSolverMINRES,_0>();
  std::shared_ptr<chrono::ChSolver>::shared_ptr<chrono::ChSolverMINRES,void>
            (&local_658,(shared_ptr<chrono::ChSolverMINRES> *)local_648);
  chrono::ChSystem::SetSolver
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_658);
  std::shared_ptr<chrono::ChSolver>::~shared_ptr(&local_658);
  peVar8 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_648);
  chrono::ChIterativeSolver::SetMaxIterations((ChIterativeSolver *)peVar8,100);
  peVar8 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_648);
  chrono::ChIterativeSolver::SetTolerance((ChIterativeSolver *)peVar8,1e-10);
  peVar8 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_648);
  chrono::ChIterativeSolver::EnableDiagonalPreconditioner((ChIterativeSolver *)peVar8,true);
  peVar8 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_648);
  chrono::ChSolver::SetVerbose((ChSolver *)(peVar8 + 0x18),true);
  chrono::ChSystem::DoStaticLinear();
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar2,"Resulting node positions:\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_3f0);
  pCVar2 = chrono::operator<<(pCVar2,(ChVector<double> *)(peVar3 + 0x20));
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_418);
  pCVar2 = chrono::operator<<(pCVar2,(ChVector<double> *)(peVar3 + 0x20));
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_440);
  pCVar2 = chrono::operator<<(pCVar2,(ChVector<double> *)(peVar3 + 0x20));
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_468);
  pCVar2 = chrono::operator<<(pCVar2,(ChVector<double> *)(peVar3 + 0x20));
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar2,"Resulting constraint reactions:\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  peVar7 = std::
           __shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&constraint2.
                            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  chrono::fea::ChLinkPointFrame::GetReactionOnBody(&local_670,peVar7);
  chrono::operator<<(pCVar2,&local_670);
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  peVar7 = std::
           __shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&constraint3.
                            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  chrono::fea::ChLinkPointFrame::GetReactionOnBody(&local_688,peVar7);
  chrono::operator<<(pCVar2,&local_688);
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  peVar7 = std::
           __shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_5a8);
  chrono::fea::ChLinkPointFrame::GetReactionOnBody(&local_6a0,peVar7);
  chrono::operator<<(pCVar2,&local_6a0);
  std::shared_ptr<chrono::ChSolverMINRES>::~shared_ptr
            ((shared_ptr<chrono::ChSolverMINRES> *)local_648);
  std::shared_ptr<chrono::fea::ChLinkPointFrame>::~shared_ptr
            ((shared_ptr<chrono::fea::ChLinkPointFrame> *)local_5a8);
  std::shared_ptr<chrono::fea::ChLinkPointFrame>::~shared_ptr
            ((shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint3.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<chrono::fea::ChLinkPointFrame>::~shared_ptr
            ((shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint2.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<chrono::ChBody>::~shared_ptr((shared_ptr<chrono::ChBody> *)local_568);
  std::shared_ptr<chrono::fea::ChElementTetraCorot_4>::~shared_ptr
            ((shared_ptr<chrono::fea::ChElementTetraCorot_4> *)local_4e8);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_468);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_440);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_418);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_3f0);
  std::shared_ptr<chrono::fea::ChContinuumElastic>::~shared_ptr
            ((shared_ptr<chrono::fea::ChContinuumElastic> *)
             &mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<chrono::fea::ChMesh>::~shared_ptr((shared_ptr<chrono::fea::ChMesh> *)local_3c0);
  chrono::ChSystemSMC::~ChSystemSMC
            ((ChSystemSMC *)
             &my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void test_2() {
    GetLog() << "\n-------------------------------------------------\n";
    GetLog() << "TEST: LINEAR tetrahedral element FEM  \n\n";

    // The physical system: it contains all physical objects.
    ChSystemSMC sys;

    // Create a mesh, that is a container for groups
    // of elements and their referenced nodes.
    auto my_mesh = chrono_types::make_shared<ChMesh>();

    // Create a material, that must be assigned to each element,
    // and set its parameters
    auto mmaterial = chrono_types::make_shared<ChContinuumElastic>();
    mmaterial->Set_E(0.01e9);  // rubber 0.01e9, steel 200e9
    mmaterial->Set_v(0.3);

    // Create some nodes. These are the classical point-like
    // nodes with x,y,z degrees of freedom, that can be used
    // for many types of FEM elements in space.
    // While creating them, also set X0 undeformed positions.
    auto mnode1 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, 0));
    auto mnode2 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, 1));
    auto mnode3 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 1, 0));
    auto mnode4 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(1, 0, 0));

    // For example, set an applied force to a node:
    mnode3->SetForce(ChVector<>(0, 10000, 0));

    // Remember to add nodes and elements to the mesh!
    my_mesh->AddNode(mnode1);
    my_mesh->AddNode(mnode2);
    my_mesh->AddNode(mnode3);
    my_mesh->AddNode(mnode4);

    // Create the tetrahedron element, and assign
    // nodes and material
    auto melement1 = chrono_types::make_shared<ChElementTetraCorot_4>();
    melement1->SetNodes(mnode1, mnode2, mnode3, mnode4);
    melement1->SetMaterial(mmaterial);

    // Remember to add elements to the mesh!
    my_mesh->AddElement(melement1);

    // Remember to add the mesh to the system!
    sys.Add(my_mesh);

    // Create also a truss
    auto truss = chrono_types::make_shared<ChBody>();
    truss->SetBodyFixed(true);
    sys.Add(truss);

    // Create a constraint between a node and the truss
    auto constraint1 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint2 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint3 = chrono_types::make_shared<ChLinkPointFrame>();

    constraint1->Initialize(mnode1,   // node
                            truss);   // body to be connected to

    constraint2->Initialize(mnode2,  // node 
                            truss);   // body to be connected to

    constraint3->Initialize(mnode4,  // node
                            truss);   // body to be connected to

    sys.Add(constraint1);
    sys.Add(constraint2);
    sys.Add(constraint3);

    // Set no gravity
    // sys.Set_G_acc(VNULL);

    // Perform a linear static analysis
    auto solver = chrono_types::make_shared<ChSolverMINRES>();
    sys.SetSolver(solver);
    solver->SetMaxIterations(100);
    solver->SetTolerance(1e-10);
    solver->EnableDiagonalPreconditioner(true);
    solver->SetVerbose(true);

    sys.DoStaticLinear();

    // Output result
    GetLog() << "Resulting node positions:\n";
    GetLog() << mnode1->pos << "\n";
    GetLog() << mnode2->pos << "\n";
    GetLog() << mnode3->pos << "\n";
    GetLog() << mnode4->pos << "\n";

    GetLog() << "Resulting constraint reactions:\n";
    GetLog() << constraint1->GetReactionOnBody();
    GetLog() << constraint2->GetReactionOnBody();
    GetLog() << constraint3->GetReactionOnBody();
}